

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::EnumLiteGenerator::EnumLiteGenerator
          (EnumLiteGenerator *this,EnumDescriptor *descriptor,bool immutable_api,Context *context)

{
  EnumDescriptor *this_00;
  int iVar1;
  int iVar2;
  ClassNameResolver *pCVar3;
  undefined1 local_58 [8];
  Alias alias;
  EnumValueDescriptor *canonical_value;
  EnumValueDescriptor *value;
  int i;
  Context *local_28;
  Context *context_local;
  EnumDescriptor *pEStack_18;
  bool immutable_api_local;
  EnumDescriptor *descriptor_local;
  EnumLiteGenerator *this_local;
  
  local_28 = context;
  context_local._7_1_ = immutable_api;
  pEStack_18 = descriptor;
  descriptor_local = (EnumDescriptor *)this;
  EnumGenerator::EnumGenerator(&this->super_EnumGenerator);
  (this->super_EnumGenerator)._vptr_EnumGenerator = (_func_int **)&PTR__EnumLiteGenerator_02a44c28;
  this->descriptor_ = pEStack_18;
  std::
  vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ::vector(&this->canonical_values_);
  std::
  vector<google::protobuf::compiler::java::EnumLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>_>
  ::vector(&this->aliases_);
  this->immutable_api_ = (bool)(context_local._7_1_ & 1);
  this->context_ = local_28;
  pCVar3 = Context::GetNameResolver(local_28);
  this->name_resolver_ = pCVar3;
  value._0_4_ = 0;
  while( true ) {
    iVar2 = (int)value;
    iVar1 = EnumDescriptor::value_count(this->descriptor_);
    if (iVar1 <= iVar2) break;
    canonical_value = EnumDescriptor::value(this->descriptor_,(int)value);
    this_00 = this->descriptor_;
    iVar2 = EnumValueDescriptor::number(canonical_value);
    alias.canonical_value = EnumDescriptor::FindValueByNumber(this_00,iVar2);
    if (canonical_value == alias.canonical_value) {
      std::
      vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
      ::push_back(&this->canonical_values_,&canonical_value);
    }
    else {
      local_58 = (undefined1  [8])canonical_value;
      alias.value = alias.canonical_value;
      std::
      vector<google::protobuf::compiler::java::EnumLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>_>
      ::push_back(&this->aliases_,(value_type *)local_58);
    }
    value._0_4_ = (int)value + 1;
  }
  return;
}

Assistant:

EnumLiteGenerator::EnumLiteGenerator(const EnumDescriptor* descriptor,
                                     bool immutable_api, Context* context)
    : descriptor_(descriptor),
      immutable_api_(immutable_api),
      context_(context),
      name_resolver_(context->GetNameResolver()) {
  for (int i = 0; i < descriptor_->value_count(); i++) {
    const EnumValueDescriptor* value = descriptor_->value(i);
    const EnumValueDescriptor* canonical_value =
        descriptor_->FindValueByNumber(value->number());

    if (value == canonical_value) {
      canonical_values_.push_back(value);
    } else {
      Alias alias;
      alias.value = value;
      alias.canonical_value = canonical_value;
      aliases_.push_back(alias);
    }
  }
}